

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeDrawList
               (ImGuiWindow *window,ImGuiViewportP *viewport,ImDrawList *draw_list,char *label)

{
  bool bVar1;
  int iVar2;
  ImDrawCmd *pIVar3;
  ImDrawList *pIVar4;
  ImDrawCmd *pIVar5;
  ImDrawList *in_RCX;
  ImDrawList *in_RDX;
  long in_RDI;
  float fVar6;
  ImDrawListFlags backup_flags;
  ImDrawVert *v;
  int n_1;
  ImVec2 triangle_1 [3];
  char *buf_end;
  char *buf_p;
  int idx_i;
  int prim;
  ImGuiListClipper clipper;
  int n;
  ImVec2 triangle [3];
  uint idx_n;
  float total_area;
  ImDrawVert *vtx_buffer;
  uint *idx_buffer;
  bool pcmd_node_open;
  char buf [300];
  char texid_desc [20];
  ImDrawCmd *pcmd;
  ImDrawList *fg_draw_list;
  bool node_open;
  int cmd_count;
  ImGuiMetricsConfig *cfg;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffc9c;
  ImTextureID in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffcac;
  ImGuiListClipper *in_stack_fffffffffffffcb0;
  char *local_348;
  ImGuiListClipper *in_stack_fffffffffffffcc0;
  uint local_32c;
  ImVec2 *local_310;
  ImGuiListClipper *pIVar7;
  undefined4 in_stack_fffffffffffffd10;
  uint in_stack_fffffffffffffd14;
  undefined8 in_stack_fffffffffffffd20;
  ImVec2 *this;
  undefined8 in_stack_fffffffffffffd28;
  ImVec2 *pIVar8;
  ImVec2 *in_stack_fffffffffffffd30;
  ImVec2 *in_stack_fffffffffffffd38;
  ImDrawList *in_stack_fffffffffffffd40;
  ImDrawCmd *pIVar9;
  ImDrawList *pIVar10;
  ImDrawList *draw_list_00;
  ImDrawListFlags IVar11;
  ImVec2 local_280;
  ImDrawVert *local_278;
  int local_26c;
  ImVec2 local_268 [2];
  ImVec2 *in_stack_fffffffffffffda8;
  ImVec2 in_stack_fffffffffffffdb0;
  ImGuiListClipper *in_stack_fffffffffffffdb8;
  uint local_23c;
  int local_238;
  int local_220;
  int local_21c;
  ImVec2 local_1f4;
  int local_1ec;
  ImVec2 local_1e8 [4];
  uint local_1c8;
  float local_1c4;
  ImDrawVert *local_1c0;
  uint *local_1b8;
  byte local_1a9;
  ImGuiListClipper local_1a8 [4];
  float in_stack_ffffffffffffff28;
  ImDrawFlags in_stack_ffffffffffffff2c;
  ImU32 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  ImVec2 *in_stack_ffffffffffffff38;
  ImDrawList *in_stack_ffffffffffffff40;
  undefined1 auStack_7c [4];
  undefined1 local_78 [24];
  ImDrawCmd *local_60;
  ImVec2 local_58;
  ImDrawList *local_50;
  ImVec4 local_48;
  byte local_35;
  int local_34;
  ImGuiMetricsConfig *local_30;
  ImGuiContext *local_28;
  ImDrawList *local_20;
  ImDrawList *local_18;
  long local_8;
  
  local_28 = GImGui;
  local_30 = &GImGui->DebugMetricsConfig;
  local_34 = (in_RDX->CmdBuffer).Size;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (((0 < local_34) &&
      (pIVar3 = ImVector<ImDrawCmd>::back(&in_RDX->CmdBuffer), pIVar3->ElemCount == 0)) &&
     (pIVar3 = ImVector<ImDrawCmd>::back(&local_18->CmdBuffer),
     pIVar3->UserCallback == (ImDrawCallback)0x0)) {
    local_34 = local_34 + -1;
  }
  if (local_18->_OwnerName == (char *)0x0) {
    pIVar3 = (ImDrawCmd *)0x2bc7ee;
  }
  else {
    pIVar3 = (ImDrawCmd *)local_18->_OwnerName;
  }
  iVar2 = local_34;
  draw_list_00 = local_18;
  local_35 = TreeNode(local_18,"%s: \'%s\' %d vtx, %d indices, %d cmds",local_20,pIVar3,
                      (ulong)(uint)(local_18->VtxBuffer).Size,
                      (ulong)(uint)(local_18->IdxBuffer).Size);
  pIVar10 = local_18;
  pIVar4 = GetWindowDrawList();
  if (pIVar10 == pIVar4) {
    SameLine(0.0,-1.0);
    ImVec4::ImVec4(&local_48,1.0,0.4,0.4,1.0);
    TextColored(&local_48,"CURRENTLY APPENDING");
    if ((local_35 & 1) != 0) {
      TreePop();
    }
  }
  else {
    local_50 = GetForegroundDrawList((ImGuiWindow *)0x2088db);
    pIVar4 = local_20;
    if (((local_8 != 0) &&
        (bVar1 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffcc0), pIVar4 = local_20,
        bVar1)) && (local_50 != (ImDrawList *)0x0)) {
      local_58 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffc9c,iVar2),(ImVec2 *)0x20893a)
      ;
      ImDrawList::AddRect(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                          in_stack_fffffffffffffd30,
                          (ImU32)((ulong)in_stack_fffffffffffffd28 >> 0x20),
                          (float)in_stack_fffffffffffffd28,
                          (ImDrawFlags)((ulong)in_stack_fffffffffffffd20 >> 0x20),
                          (float)in_stack_fffffffffffffd20);
      pIVar4 = local_20;
    }
    if ((local_35 & 1) != 0) {
      if ((local_8 != 0) && ((*(byte *)(local_8 + 0xcb) & 1) == 0)) {
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
      }
      for (local_60 = (local_18->CmdBuffer).Data; local_60 < (local_18->CmdBuffer).Data + local_34;
          local_60 = local_60 + 1) {
        if (local_60->UserCallback == (ImDrawCallback)0x0) {
          FormatTextureIDForDebugDisplay
                    ((char *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,
                     in_stack_fffffffffffffca0);
          ImFormatString((char *)(double)(local_60->ClipRect).x,
                         (size_t)(double)(local_60->ClipRect).y,
                         (char *)(double)(local_60->ClipRect).z,(double)(local_60->ClipRect).w,
                         local_1a8,300,
                         "DrawCmd:%5d tris, Tex %s, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                         (ulong)local_60->ElemCount / 3,local_78);
          pIVar9 = local_60;
          pIVar5 = ImVector<ImDrawCmd>::begin(&local_18->CmdBuffer);
          local_1a9 = TreeNode((void *)(((long)pIVar9 - (long)pIVar5) / 0x38),"%s",local_1a8);
          bVar1 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffcc0);
          if ((bVar1) &&
             ((((local_30->ShowDrawCmdMesh & 1U) != 0 ||
               ((local_30->ShowDrawCmdBoundingBoxes & 1U) != 0)) && (local_50 != (ImDrawList *)0x0))
             )) {
            DebugNodeDrawCmdShowMeshAndBoundingBox
                      (pIVar4,draw_list_00,pIVar3,SUB81((ulong)pIVar10 >> 0x38,0),
                       SUB81((ulong)pIVar10 >> 0x30,0));
          }
          if ((local_1a9 & 1) != 0) {
            if ((local_18->IdxBuffer).Size < 1) {
              local_1b8 = (uint *)0x0;
            }
            else {
              local_1b8 = (local_18->IdxBuffer).Data;
            }
            local_1c0 = (local_18->VtxBuffer).Data + local_60->VtxOffset;
            local_1c4 = 0.0;
            local_1c8 = local_60->IdxOffset;
            while (local_1c8 < local_60->IdxOffset + local_60->ElemCount) {
              this = local_1e8;
              pIVar8 = local_1e8 + 3;
              do {
                ImVec2::ImVec2(this);
                this = this + 1;
              } while (this != pIVar8);
              for (local_1ec = 0; local_1ec < 3; local_1ec = local_1ec + 1) {
                in_stack_fffffffffffffd14 = local_1c8;
                if (local_1b8 != (uint *)0x0) {
                  in_stack_fffffffffffffd14 = local_1b8[local_1c8];
                }
                local_1e8[local_1ec] = local_1c0[in_stack_fffffffffffffd14].pos;
                local_1c8 = local_1c8 + 1;
              }
              fVar6 = ImTriangleArea(local_1e8,local_1e8 + 1,local_1e8 + 2);
              local_1c4 = fVar6 + local_1c4;
            }
            ImFormatString((char *)(double)local_1c4,(size_t)local_1a8,(char *)0x12c,
                           "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                           (ulong)local_60->ElemCount,(ulong)local_60->VtxOffset,
                           (ulong)local_60->IdxOffset);
            pIVar7 = local_1a8;
            ImVec2::ImVec2(&local_1f4,0.0,0.0);
            Selectable((char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0.y._3_1_,
                       (ImGuiSelectableFlags)in_stack_fffffffffffffdb0.x,in_stack_fffffffffffffda8);
            bVar1 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffcc0);
            if ((bVar1) && (local_50 != (ImDrawList *)0x0)) {
              DebugNodeDrawCmdShowMeshAndBoundingBox
                        (pIVar4,draw_list_00,pIVar3,SUB81((ulong)pIVar10 >> 0x38,0),
                         SUB81((ulong)pIVar10 >> 0x30,0));
            }
            ImGuiListClipper::ImGuiListClipper((ImGuiListClipper *)0x208e49);
            ImGuiListClipper::Begin
                      ((ImGuiListClipper *)
                       CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                       (int)((ulong)pIVar7 >> 0x20),SUB84(pIVar7,0));
            while (bVar1 = ImGuiListClipper::Step(in_stack_fffffffffffffcb0), bVar1) {
              local_238 = local_220;
              local_23c = local_60->IdxOffset + local_220 * 3;
              for (; local_238 < local_21c; local_238 = local_238 + 1) {
                in_stack_fffffffffffffdb8 = local_1a8;
                in_stack_fffffffffffffdb0 = (ImVec2)auStack_7c;
                local_310 = local_268;
                do {
                  ImVec2::ImVec2(local_310);
                  local_310 = local_310 + 1;
                } while (local_310 != (ImVec2 *)&stack0xfffffffffffffdb0);
                for (local_26c = 0; local_26c < 3; local_26c = local_26c + 1) {
                  if (local_1b8 == (uint *)0x0) {
                    local_32c = local_23c;
                  }
                  else {
                    local_32c = local_1b8[(int)local_23c];
                  }
                  local_278 = local_1c0 + local_32c;
                  in_stack_fffffffffffffcc0 = in_stack_fffffffffffffdb8;
                  local_268[local_26c] = local_278->pos;
                  if (local_26c == 0) {
                    local_348 = "Vert:";
                  }
                  else {
                    local_348 = "     ";
                  }
                  pIVar7 = in_stack_fffffffffffffcc0;
                  iVar2 = ImFormatString((char *)(double)(local_278->pos).x,
                                         (size_t)(double)(local_278->pos).y,
                                         (char *)(double)(local_278->uv).x,(double)(local_278->uv).y
                                         ,in_stack_fffffffffffffcc0,
                                         (long)in_stack_fffffffffffffdb0 -
                                         (long)in_stack_fffffffffffffcc0,
                                         "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                         local_348,(ulong)local_23c,(ulong)local_278->col);
                  in_stack_fffffffffffffdb8 = (ImGuiListClipper *)((long)&pIVar7->Ctx + (long)iVar2)
                  ;
                  local_23c = local_23c + 1;
                }
                in_stack_fffffffffffffcb0 = local_1a8;
                ImVec2::ImVec2(&local_280,0.0,0.0);
                Selectable((char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0.y._3_1_,
                           (ImGuiSelectableFlags)in_stack_fffffffffffffdb0.x,
                           in_stack_fffffffffffffda8);
                if (local_50 != (ImDrawList *)0x0) {
                  bVar1 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffcc0);
                  in_stack_fffffffffffffcac = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcac);
                  if (bVar1) {
                    IVar11 = local_50->Flags;
                    local_50->Flags = local_50->Flags & 0xfffffffe;
                    ImDrawList::AddPolyline
                              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                               in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                               in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
                    local_50->Flags = IVar11;
                  }
                }
              }
            }
            TreePop();
            ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)0x2091de);
          }
        }
        else {
          BulletText("Callback %p, user_data %p",local_60->UserCallback,local_60->UserCallbackData);
        }
      }
      TreePop();
    }
  }
  return;
}

Assistant:

void ImGui::DebugNodeDrawList(ImGuiWindow* window, ImGuiViewportP* viewport, const ImDrawList* draw_list, const char* label)
{
    ImGuiContext& g = *GImGui;
    IM_UNUSED(viewport); // Used in docking branch
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    int cmd_count = draw_list->CmdBuffer.Size;
    if (cmd_count > 0 && draw_list->CmdBuffer.back().ElemCount == 0 && draw_list->CmdBuffer.back().UserCallback == NULL)
        cmd_count--;
    bool node_open = TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, cmd_count);
    if (draw_list == GetWindowDrawList())
    {
        SameLine();
        TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
        if (node_open)
            TreePop();
        return;
    }

    ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
    if (window && IsItemHovered() && fg_draw_list)
        fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!node_open)
        return;

    if (window && !window->WasActive)
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

    for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.Data; pcmd < draw_list->CmdBuffer.Data + cmd_count; pcmd++)
    {
        if (pcmd->UserCallback)
        {
            BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
            continue;
        }

        char texid_desc[20];
        FormatTextureIDForDebugDisplay(texid_desc, IM_ARRAYSIZE(texid_desc), pcmd->TextureId);
        char buf[300];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d tris, Tex %s, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
            pcmd->ElemCount / 3, texid_desc, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
        bool pcmd_node_open = TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
        if (IsItemHovered() && (cfg->ShowDrawCmdMesh || cfg->ShowDrawCmdBoundingBoxes) && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, cfg->ShowDrawCmdMesh, cfg->ShowDrawCmdBoundingBoxes);
        if (!pcmd_node_open)
            continue;

        // Calculate approximate coverage area (touched pixel count)
        // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
        const ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
        const ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + pcmd->VtxOffset;
        float total_area = 0.0f;
        for (unsigned int idx_n = pcmd->IdxOffset; idx_n < pcmd->IdxOffset + pcmd->ElemCount; )
        {
            ImVec2 triangle[3];
            for (int n = 0; n < 3; n++, idx_n++)
                triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos;
            total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
        }

        // Display vertex information summary. Hover to get all triangles drawn in wire-frame
        ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
        Selectable(buf);
        if (IsItemHovered() && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, true, false);

        // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
        ImGuiListClipper clipper;
        clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
        while (clipper.Step())
            for (int prim = clipper.DisplayStart, idx_i = pcmd->IdxOffset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
            {
                char* buf_p = buf, * buf_end = buf + IM_ARRAYSIZE(buf);
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++, idx_i++)
                {
                    const ImDrawVert& v = vtx_buffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                    triangle[n] = v.pos;
                    buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                        (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                }

                Selectable(buf, false);
                if (fg_draw_list && IsItemHovered())
                {
                    ImDrawListFlags backup_flags = fg_draw_list->Flags;
                    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), ImDrawFlags_Closed, 1.0f);
                    fg_draw_list->Flags = backup_flags;
                }
            }
        TreePop();
    }
    TreePop();
}